

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImage2DAlignCase::createTexture(TexImage2DAlignCase *this)

{
  deUint32 format;
  deUint32 type;
  deInt32 rowPitch_00;
  float fVar1;
  float fVar2;
  int iVar3;
  reference pvVar4;
  PixelBufferAccess local_f8;
  int local_d0;
  deInt32 local_cc;
  int cellSize;
  int rowPitch;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  undefined1 local_98 [8];
  Vec4 colorB;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  undefined1 local_58 [8];
  Vec4 colorA;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  TexImage2DAlignCase *this_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  for (levelH = 0; levelH < (this->super_Texture2DSpecCase).m_numLevels; levelH = levelH + 1) {
    colorA.m_data[3] =
         (float)de::max<int>(1,(this->super_Texture2DSpecCase).m_width >> ((byte)levelH & 0x1f));
    colorA.m_data[2] =
         (float)de::max<int>(1,(this->super_Texture2DSpecCase).m_height >> ((byte)levelH & 0x1f));
    tcu::Vector<float,_4>::Vector(&local_78,1.0,0.0,0.0,1.0);
    tcu::operator-((tcu *)(colorB.m_data + 2),
                   &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax,
                   &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
    tcu::operator*((tcu *)&local_68,&local_78,(Vector<float,_4> *)(colorB.m_data + 2));
    tcu::operator+((tcu *)local_58,&local_68,
                   &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
    tcu::Vector<float,_4>::Vector(&local_b8,0.0,1.0,0.0,1.0);
    tcu::operator-((tcu *)&cellSize,&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax,
                   &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
    tcu::operator*((tcu *)&local_a8,&local_b8,(Vector<float,_4> *)&cellSize);
    tcu::operator+((tcu *)local_98,&local_a8,
                   &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
    fVar1 = colorA.m_data[3];
    iVar3 = tcu::TextureFormat::getPixelSize(&(this->super_Texture2DSpecCase).m_texFormat);
    local_cc = deAlign32((int)fVar1 * iVar3,this->m_alignment);
    iVar3 = de::min<int>((int)colorA.m_data[3] >> 2,(int)colorA.m_data[2] >> 2);
    local_d0 = de::max<int>(1,iVar3);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
               (long)(local_cc * (int)colorA.m_data[2]));
    fVar2 = colorA.m_data[3];
    fVar1 = colorA.m_data[2];
    rowPitch_00 = local_cc;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_f8,&(this->super_Texture2DSpecCase).m_texFormat,(int)fVar2,(int)fVar1,1,
               rowPitch_00,0,pvVar4);
    tcu::fillWithGrid(&local_f8,local_d0,(Vec4 *)local_58,(Vec4 *)local_98);
    fVar2 = colorA.m_data[3];
    fVar1 = colorA.m_data[2];
    iVar3 = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
    format = this->m_format;
    type = this->m_dataType;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
               levelH,iVar3,(int)fVar2,(int)fVar1,0,format,type,pvVar4);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		vector<deUint8>		data;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, m_alignment);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*(m_texFormatInfo.valueMax-m_texFormatInfo.valueMin) + m_texFormatInfo.valueMin;
			int		rowPitch	= deAlign32(levelW*m_texFormat.getPixelSize(), m_alignment);
			int		cellSize	= de::max(1, de::min(levelW >> 2, levelH >> 2));

			data.resize(rowPitch*levelH);
			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, levelW, levelH, 1, rowPitch, 0, &data[0]), cellSize, colorA, colorB);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, &data[0]);
		}
	}